

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

void __thiscall
wasm::IRBuilder::setDebugLocation(IRBuilder *this,optional<wasm::Function::DebugLocation> *loc)

{
  NoDebug local_9;
  
  if ((loc->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,(DebugLocation *)loc);
    return;
  }
  std::
  variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>::
  operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
             *)&this->debugLoc,&local_9);
  return;
}

Assistant:

void IRBuilder::setDebugLocation(
  const std::optional<Function::DebugLocation>& loc) {
  if (loc) {
    DBG(std::cerr << "setting debugloc " << loc->fileIndex << ":"
                  << loc->lineNumber << ":" << loc->columnNumber << "\n";);
  } else {
    DBG(std::cerr << "setting debugloc to none\n";);
  }
  if (loc) {
    debugLoc = *loc;
  } else {
    debugLoc = NoDebug();
  }
}